

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O3

void __thiscall Intel_V4L2::~Intel_V4L2(Intel_V4L2 *this)

{
  ~Intel_V4L2(this);
  operator_delete(this);
  return;
}

Assistant:

Intel_V4L2::~Intel_V4L2 () {
    if (NULL != m_pV4l2Buffer)
        free (m_pV4l2Buffer);
    if (NULL != m_pBigBuffer)
        free (m_pBigBuffer);
    
    if (0 > m_fd) return;

    if (0 > ioctl (m_fd, VIDIOC_STREAMOFF, &m_bufType)) {
        perror ("Intel_V4L2::~Intel_V4L2 : VIDIOC_STREAMOFF : ");
    }

    close (m_fd);
}